

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int instack(CallInfo *ci,TValue *o)

{
  long lVar1;
  StkId base;
  int pos;
  TValue *o_local;
  CallInfo *ci_local;
  
  lVar1 = (ci->func).offset + 0x10;
  base._4_4_ = 0;
  while( true ) {
    if ((ci->top).p <= (StkId)(lVar1 + (long)base._4_4_ * 0x10)) {
      return -1;
    }
    if (o == (TValue *)(lVar1 + (long)base._4_4_ * 0x10)) break;
    base._4_4_ = base._4_4_ + 1;
  }
  return base._4_4_;
}

Assistant:

static int instack (CallInfo *ci, const TValue *o) {
  int pos;
  StkId base = ci->func.p + 1;
  for (pos = 0; base + pos < ci->top.p; pos++) {
    if (o == s2v(base + pos))
      return pos;
  }
  return -1;  /* not found */
}